

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_QueuePush(Pdr_Man_t *p,Pdr_Obl_t *pObl)

{
  int iVar1;
  Pdr_Obl_t *pPVar2;
  Pdr_Obl_t **ppPVar3;
  
  p->nObligs = p->nObligs + 1;
  iVar1 = p->nQueCur + 1;
  p->nQueCur = iVar1;
  if (iVar1 < p->nQueMax) {
    iVar1 = p->nQueMax;
  }
  p->nQueMax = iVar1;
  pObl->nRefs = pObl->nRefs + 1;
  pPVar2 = p->pQueue;
  ppPVar3 = &p->pQueue;
  if (pPVar2 != (Pdr_Obl_t *)0x0) {
    for (; ((pPVar2 != (Pdr_Obl_t *)0x0 && (pPVar2->iFrame <= pObl->iFrame)) &&
           ((pPVar2->iFrame != pObl->iFrame || (pPVar2->prio <= pObl->prio))));
        pPVar2 = pPVar2->pLink) {
      ppPVar3 = &pPVar2->pLink;
    }
    *ppPVar3 = pObl;
    pObl->pLink = pPVar2;
    return;
  }
  *ppPVar3 = pObl;
  return;
}

Assistant:

void Pdr_QueuePush( Pdr_Man_t * p, Pdr_Obl_t * pObl )
{
    Pdr_Obl_t * pTemp, ** ppPrev;
    p->nObligs++;
    p->nQueCur++;
    p->nQueMax = Abc_MaxInt( p->nQueMax, p->nQueCur );
    Pdr_OblRef( pObl );
    if ( p->pQueue == NULL )
    {
        p->pQueue = pObl;
        return;
    }
    for ( ppPrev = &p->pQueue, pTemp = p->pQueue; pTemp; ppPrev = &pTemp->pLink, pTemp = pTemp->pLink )
        if ( pTemp->iFrame > pObl->iFrame || (pTemp->iFrame == pObl->iFrame && pTemp->prio > pObl->prio) )
            break;
    *ppPrev = pObl;
    pObl->pLink = pTemp;
}